

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::DelayedTerminalArgSyntax::setChild
          (DelayedTerminalArgSyntax *this,size_t index,TokenOrSyntax child)

{
  Info *pIVar1;
  undefined1 uVar2;
  NumericTokenFlags NVar3;
  uint32_t uVar4;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar5;
  ExpressionSyntax *pEVar6;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar7;
  logic_error *this_00;
  long *plVar8;
  size_type *psVar9;
  long *plVar10;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (3 < index) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O3/extern/slang/source/AllSyntax.cpp"
               ,"");
    plVar8 = (long *)std::__cxx11::string::append((char *)local_d0);
    local_b0._M_dataplus._M_p = (pointer)*plVar8;
    psVar9 = (size_type *)(plVar8 + 2);
    if ((size_type *)local_b0._M_dataplus._M_p == psVar9) {
      local_b0.field_2._M_allocated_capacity = *psVar9;
      local_b0.field_2._8_8_ = plVar8[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar9;
    }
    local_b0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::to_string(&local_70,0x10d7);
    std::operator+(&local_50,&local_b0,&local_70);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (long *)*plVar8;
    plVar10 = plVar8 + 2;
    if (local_90 == plVar10) {
      local_80 = *plVar10;
      lStack_78 = plVar8[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar10;
    }
    local_88 = plVar8[1];
    *plVar8 = (long)plVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_f0 = (long *)*plVar8;
    plVar10 = plVar8 + 2;
    if (local_f0 == plVar10) {
      local_e0 = *plVar10;
      lStack_d8 = plVar8[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar10;
    }
    local_e8 = plVar8[1];
    *plVar8 = (long)plVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::logic_error::logic_error(this_00,(string *)&local_f0);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  switch(index) {
  case 0:
    pvVar7 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar2 = pvVar7->field_0x2;
    NVar3.raw = (pvVar7->numFlags).raw;
    uVar4 = pvVar7->rawLen;
    pIVar1 = pvVar7->info;
    (this->terminal).kind = pvVar7->kind;
    (this->terminal).field_0x2 = uVar2;
    (this->terminal).numFlags = (NumericTokenFlags)NVar3.raw;
    (this->terminal).rawLen = uVar4;
    (this->terminal).info = pIVar1;
    break;
  case 1:
    pvVar7 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar2 = pvVar7->field_0x2;
    NVar3.raw = (pvVar7->numFlags).raw;
    uVar4 = pvVar7->rawLen;
    pIVar1 = pvVar7->info;
    (this->openBracket).kind = pvVar7->kind;
    (this->openBracket).field_0x2 = uVar2;
    (this->openBracket).numFlags = (NumericTokenFlags)NVar3.raw;
    (this->openBracket).rawLen = uVar4;
    (this->openBracket).info = pIVar1;
    break;
  case 2:
    ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar5 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x1b,
                 "slang::not_null<slang::syntax::ExpressionSyntax *>::not_null(U &&) [T = slang::syntax::ExpressionSyntax *, U = slang::syntax::ExpressionSyntax *]"
                );
    }
    ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pEVar6 = SyntaxNode::as<slang::syntax::ExpressionSyntax>(*ppSVar5);
    (this->expr).ptr = pEVar6;
    break;
  case 3:
    pvVar7 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar2 = pvVar7->field_0x2;
    NVar3.raw = (pvVar7->numFlags).raw;
    uVar4 = pvVar7->rawLen;
    pIVar1 = pvVar7->info;
    (this->closeBracket).kind = pvVar7->kind;
    (this->closeBracket).field_0x2 = uVar2;
    (this->closeBracket).numFlags = (NumericTokenFlags)NVar3.raw;
    (this->closeBracket).rawLen = uVar4;
    (this->closeBracket).info = pIVar1;
  }
  return;
}

Assistant:

void DelayedTerminalArgSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: terminal = child.token(); return;
        case 1: openBracket = child.token(); return;
        case 2: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 3: closeBracket = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}